

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# popt.c
# Opt level: O0

int poptBitsClr(poptBits bits)

{
  size_t nw;
  poptBits bits_local;
  
  if (bits == (poptBits)0x0) {
    bits_local._4_4_ = -0x14;
  }
  else {
    memset(bits,0,((ulong)(_poptBitsM - 1 >> 5) + 1) * poptBitsClr::nbw);
    bits_local._4_4_ = 0;
  }
  return bits_local._4_4_;
}

Assistant:

int poptBitsClr(poptBits bits)
{
    static size_t nbw = (__PBM_NBITS/8);
    size_t nw = (__PBM_IX(_poptBitsM-1) + 1);

    if (bits == NULL)
	return POPT_ERROR_NULLARG;
    memset(bits, 0, nw * nbw);
    return 0;
}